

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O1

bool __thiscall ON_RTreeIterator::Last(ON_RTreeIterator *this)

{
  int iVar1;
  ON_RTreeNode *pOVar2;
  bool bVar3;
  
  this->m_sp = (StackElement *)0x0;
  pOVar2 = this->m_root;
  if (((pOVar2 != (ON_RTreeNode *)0x0) && (-1 < pOVar2->m_level)) &&
     (iVar1 = pOVar2->m_count, 0 < iVar1)) {
    this->m_stack[0].m_node = pOVar2;
    this->m_stack[0].m_branchIndex = iVar1 + -1;
    bVar3 = PushChildren(this,this->m_stack,false);
    return bVar3;
  }
  return false;
}

Assistant:

bool ON_RTreeIterator::Last()
{ 
  m_sp = 0;
  if ( 0 == m_root || m_root->m_level < 0 || m_root->m_count <= 0 )
    return false;
  m_stack[0].m_node = m_root;
  m_stack[0].m_branchIndex = m_root->m_count - 1;
  return PushChildren(&m_stack[0],false);
}